

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O0

ssize_t __thiscall r_comp::ObjectMap::read(ObjectMap *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  undefined8 local_28;
  size_t i;
  size_t size_local;
  uint32_t *data_local;
  ObjectMap *this_local;
  
  for (local_28 = (void *)0x0; local_28 < __buf; local_28 = (void *)((long)local_28 + 1)) {
    r_code::vector<unsigned_int>::push_back
              (&this->objects,*(uint *)(CONCAT44(in_register_00000034,__fd) + (long)local_28 * 4));
  }
  return (ssize_t)local_28;
}

Assistant:

void ObjectMap::read(uint32_t *data, size_t size)
{
    for (size_t i = 0; i < size; ++i) {
        objects.push_back(data[i]);
    }
}